

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arguments.cc
# Opt level: O1

void __thiscall
phosg::Arguments::Arguments
          (Arguments *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  (this->named)._M_h._M_buckets = &(this->named)._M_h._M_single_bucket;
  (this->named)._M_h._M_bucket_count = 1;
  (this->named)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->named)._M_h._M_element_count = 0;
  (this->named)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->named)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->named)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->positional).
  super__Vector_base<phosg::Arguments::ArgText,_std::allocator<phosg::Arguments::ArgText>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->positional).
  super__Vector_base<phosg::Arguments::ArgText,_std::allocator<phosg::Arguments::ArgText>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->positional).
  super__Vector_base<phosg::Arguments::ArgText,_std::allocator<phosg::Arguments::ArgText>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  parse(this,args);
  return;
}

Assistant:

Arguments::Arguments(vector<string>&& args) {
  this->parse(std::move(args));
}